

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList(ImDrawList *draw_list,char *label)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawVert *pIVar4;
  ImVec2 cr_max;
  ImGuiContext *pIVar5;
  ImDrawList *this;
  float fVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  ImDrawCmd *pIVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  ImDrawCmd *pIVar15;
  int iVar16;
  unsigned_short *puVar17;
  ImGuiListClipper clipper;
  ImVec2 triangles_pos [3];
  ImRect clip_rect;
  int iVar18;
  int local_1cc;
  undefined1 local_1c8 [12];
  float fStack_1bc;
  uint uStack_1b8;
  uint local_1b4;
  ImDrawCmd *local_1b0;
  ImDrawList *local_1a8;
  ulong local_1a0;
  uint local_194;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  undefined1 local_168 [12];
  float fStack_15c;
  
  pcVar12 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar12 = draw_list->_OwnerName;
  }
  iVar18 = (draw_list->CmdBuffer).Size;
  bVar7 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar12,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar18);
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  if (pIVar3->DrawList == draw_list) {
    pIVar3->Accessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar5->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
      (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    local_168._0_4_ = 1.0;
    local_168._4_4_ = 0.3921569;
    local_168._8_4_ = 0.3921569;
    fStack_15c = 1.0;
    TextColored((ImVec4 *)local_168,"CURRENTLY APPENDING");
    if (!bVar7) {
      return;
    }
  }
  else {
    if (!bVar7) {
      return;
    }
    local_1a8 = &pIVar5->OverlayDrawList;
    cr_max.y = GNullClipRect.w;
    cr_max.x = GNullClipRect.z;
    ImDrawList::PushClipRect(local_1a8,GNullClipRect._0_8_,cr_max,false);
    if (0 < (draw_list->CmdBuffer).Size) {
      pIVar11 = (draw_list->CmdBuffer).Data;
      local_1cc = 0;
      pIVar15 = pIVar11;
      do {
        if (pIVar15->UserCallback == (ImDrawCallback)0x0) {
          if ((draw_list->IdxBuffer).Size < 1) {
            pcVar12 = "non-indexed";
            puVar17 = (unsigned_short *)0x0;
          }
          else {
            puVar17 = (draw_list->IdxBuffer).Data;
            pcVar12 = "indexed";
          }
          local_1b0 = pIVar15;
          cVar8 = TreeNode((void *)(((long)pIVar15 - (long)pIVar11 >> 4) * -0x5555555555555555),
                           "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)",
                           SUB84((double)(pIVar15->ClipRect).x,0),
                           SUB84((double)(pIVar15->ClipRect).y,0),(double)(pIVar15->ClipRect).z,
                           (double)(pIVar15->ClipRect).w,(ulong)pIVar15->ElemCount,pcVar12,
                           pIVar15->TextureId,pIVar15,iVar18);
          this = local_1a8;
          if ((show_clip_rects == true) &&
             ((GImGui->CurrentWindow->DC).LastItemHoveredAndUsable == true)) {
            local_1a0 = CONCAT71(local_1a0._1_7_,cVar8);
            local_168._0_4_ = (local_1b0->ClipRect).x;
            local_168._4_4_ = (local_1b0->ClipRect).y;
            local_168._8_4_ = (local_1b0->ClipRect).z;
            fStack_15c = (local_1b0->ClipRect).w;
            local_1c8._8_4_ = -3.4028235e+38;
            fStack_1bc = -3.4028235e+38;
            local_1c8._0_4_ = 3.4028235e+38;
            local_1c8._4_4_ = 3.4028235e+38;
            if (0 < (int)local_1b0->ElemCount) {
              lVar13 = (long)local_1cc;
              local_1c8._4_4_ = 3.4028235e+38;
              local_1c8._0_4_ = 3.4028235e+38;
              fStack_1bc = -3.4028235e+38;
              local_1c8._8_4_ = -3.4028235e+38;
              do {
                if (puVar17 == (unsigned_short *)0x0) {
                  uVar10 = (uint)lVar13;
                }
                else {
                  uVar10 = (uint)puVar17[lVar13];
                }
                if ((draw_list->VtxBuffer).Size <= (int)uVar10) {
LAB_0014d0d4:
                  __assert_fail("i < Size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                                ,0x353,
                                "value_type &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]"
                               );
                }
                pIVar4 = (draw_list->VtxBuffer).Data;
                fVar1 = pIVar4[(int)uVar10].pos.x;
                fVar2 = pIVar4[(int)uVar10].pos.y;
                fVar6 = fVar1;
                if ((float)local_1c8._0_4_ <= fVar1) {
                  fVar6 = (float)local_1c8._0_4_;
                }
                local_1c8._0_4_ = fVar6;
                fVar6 = fVar2;
                if ((float)local_1c8._4_4_ <= fVar2) {
                  fVar6 = (float)local_1c8._4_4_;
                }
                local_1c8._4_4_ = fVar6;
                if (fVar1 <= (float)local_1c8._8_4_) {
                  fVar1 = (float)local_1c8._8_4_;
                }
                local_1c8._8_4_ = fVar1;
                if (fVar2 <= fStack_1bc) {
                  fVar2 = fStack_1bc;
                }
                fStack_1bc = fVar2;
                lVar13 = lVar13 + 1;
              } while (lVar13 < (int)(local_1b0->ElemCount + local_1cc));
            }
            local_168._0_4_ = (undefined4)(int)(float)local_168._0_4_;
            local_168._8_4_ = (undefined4)(int)(float)local_168._8_4_;
            fStack_15c = (float)(int)fStack_15c;
            local_168._4_4_ = (undefined4)(int)(float)local_168._4_4_;
            ImDrawList::AddRect(local_1a8,(ImVec2 *)local_168,(ImVec2 *)(local_168 + 8),0xff00ffff,
                                0.0,0xf,1.0);
            local_1c8._8_4_ = (undefined4)(int)(float)local_1c8._8_4_;
            fStack_1bc = (float)(int)fStack_1bc;
            local_1c8._4_4_ = (float)(int)(float)local_1c8._4_4_;
            local_1c8._0_4_ = (float)(int)(float)local_1c8._0_4_;
            ImDrawList::AddRect(this,(ImVec2 *)local_1c8,(ImVec2 *)(local_1c8 + 8),0xffff00ff,0.0,
                                0xf,1.0);
            cVar8 = (char)local_1a0;
          }
          pIVar15 = local_1b0;
          if (cVar8 != '\0') {
            pIVar3 = GImGui->CurrentWindow;
            local_1c8._4_4_ = -1.0;
            local_1c8._0_4_ = ((pIVar3->DC).CursorPos.y - (pIVar3->Pos).y) + (pIVar3->Scroll).y;
            local_1c8._8_4_ = local_1b0->ElemCount / 3;
            fStack_1bc = 0.0;
            uStack_1b8 = 0xffffffff;
            local_1b4 = 0xffffffff;
            while (bVar7 = ImGuiListClipper::Step((ImGuiListClipper *)local_1c8), bVar7) {
              local_194 = local_1b4;
              if ((int)uStack_1b8 < (int)local_1b4) {
                iVar16 = uStack_1b8 * 3 + local_1cc;
                uVar10 = uStack_1b8;
                do {
                  pcVar12 = local_168;
                  local_1a0 = (ulong)uVar10;
                  local_188[0].x = 0.0;
                  local_188[0].y = 0.0;
                  local_188[1].x = 0.0;
                  local_188[1].y = 0.0;
                  local_188[2].x = 0.0;
                  local_188[2].y = 0.0;
                  lVar13 = 0;
                  do {
                    if (puVar17 == (unsigned_short *)0x0) {
                      uVar10 = (int)lVar13 + iVar16;
                    }
                    else {
                      uVar10 = (uint)puVar17[iVar16 + lVar13];
                    }
                    if ((draw_list->VtxBuffer).Size <= (int)uVar10) goto LAB_0014d0d4;
                    pIVar4 = (draw_list->VtxBuffer).Data;
                    local_188[lVar13] = pIVar4[(int)uVar10].pos;
                    pcVar14 = "   ";
                    if (lVar13 == 0) {
                      pcVar14 = "vtx";
                    }
                    iVar9 = sprintf(pcVar12,
                                    "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n"
                                    ,SUB84((double)pIVar4[(int)uVar10].pos.x,0),
                                    SUB84((double)pIVar4[(int)uVar10].pos.y,0),
                                    (double)pIVar4[(int)uVar10].uv.x,
                                    (double)pIVar4[(int)uVar10].uv.y,pcVar14,
                                    (ulong)(uint)(iVar16 + (int)lVar13),
                                    (ulong)pIVar4[(int)uVar10].col);
                    pcVar12 = pcVar12 + iVar9;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                  local_190.x = 0.0;
                  local_190.y = 0.0;
                  Selectable(local_168,false,0,&local_190);
                  if ((GImGui->CurrentWindow->DC).LastItemHoveredAndUsable == true) {
                    ImDrawList::AddPolyline(local_1a8,local_188,3,0xff00ffff,true,1.0,false);
                  }
                  iVar16 = iVar16 + 3;
                  uVar10 = (int)local_1a0 + 1;
                } while (uVar10 != local_194);
              }
            }
            TreePop();
            pIVar15 = local_1b0;
            if ((float)local_1c8._8_4_ != -NAN) {
              __assert_fail("ItemsCount == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                            ,0x439,"ImGuiListClipper::~ImGuiListClipper()");
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar15->UserCallback,pIVar15->UserCallbackData);
        }
        local_1cc = local_1cc + pIVar15->ElemCount;
        pIVar15 = pIVar15 + 1;
        pIVar11 = (draw_list->CmdBuffer).Data;
      } while (pIVar15 < pIVar11 + (draw_list->CmdBuffer).Size);
    }
    ImDrawList::PopClipRect(local_1a8);
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImDrawList* draw_list, const char* label)
            {
                bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
                if (draw_list == ImGui::GetWindowDrawList())
                {
                    ImGui::SameLine();
                    ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                    if (node_open) ImGui::TreePop();
                    return;
                }
                if (!node_open)
                    return;

                ImDrawList* overlay_draw_list = &GImGui->OverlayDrawList;   // Render additional visuals into the top-most draw list
                overlay_draw_list->PushClipRectFullScreen();
                int elem_offset = 0;
                for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
                {
                    if (pcmd->UserCallback)
                    {
                        ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                        continue;
                    }
                    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                    bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                    if (show_clip_rects && ImGui::IsItemHovered())
                    {
                        ImRect clip_rect = pcmd->ClipRect;
                        ImRect vtxs_rect;
                        for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                            vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                        clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                        vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                    }
                    if (!pcmd_node_open)
                        continue;
                    ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                    while (clipper.Step())
                        for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                        {
                            char buf[300], *buf_p = buf;
                            ImVec2 triangles_pos[3];
                            for (int n = 0; n < 3; n++, vtx_i++)
                            {
                                ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                                triangles_pos[n] = v.pos;
                                buf_p += sprintf(buf_p, "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                            }
                            ImGui::Selectable(buf, false);
                            if (ImGui::IsItemHovered())
                                overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f, false);  // Add triangle without AA, more readable for large-thin triangle
                        }
                    ImGui::TreePop();
                }
                overlay_draw_list->PopClipRect();
                ImGui::TreePop();
            }